

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hpp
# Opt level: O0

index_t type_safe::operator+(index_t *lhs,difference_t *rhs)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  integer_type_conflict1 *piVar4;
  ulong *puVar5;
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> local_188;
  integer_type_conflict1 local_178;
  ulong local_160;
  ulong local_150;
  integer_type_conflict1 local_148;
  integer_type_conflict1 local_140;
  difference_t *local_138;
  difference_t *rhs_local;
  index_t *lhs_local;
  integer_type_conflict1 local_120;
  integer_type_conflict1 local_118;
  integer_type_conflict1 *local_110;
  undefined1 local_108 [8];
  integer_type_conflict1 local_100;
  integer<long,_type_safe::undefined_behavior_arithmetic> *local_f8;
  ulong *local_f0;
  undefined1 local_e8 [8];
  ulong local_e0;
  ulong local_d8;
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_d0;
  undefined1 local_c8 [8];
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_c0;
  char *local_b8;
  undefined4 local_b0;
  regular_void local_a1;
  integer_type_conflict1 *local_a0;
  integer<long,_type_safe::undefined_behavior_arithmetic> *local_98;
  ulong *local_90;
  integer_type_conflict1 *local_88;
  integer_type_conflict1 *local_80;
  undefined1 *local_78;
  char *local_70;
  undefined4 local_68;
  regular_void local_59;
  long local_58;
  ulong local_50;
  ulong *local_48;
  undefined1 *local_40;
  integer_type_conflict1 *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined4 local_20;
  regular_void local_11;
  ulong *local_10;
  
  local_138 = rhs;
  rhs_local = (difference_t *)lhs;
  local_d0 = get<type_safe::index_t,type_safe::integer<unsigned_long,type_safe::undefined_behavior_arithmetic>>
                       (&lhs->
                         super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
                       );
  uVar1 = local_d0->value_;
  local_10 = &local_e0;
  local_e0 = uVar1;
  local_c0 = local_d0;
  uVar3 = std::numeric_limits<long>::max();
  if (uVar3 < uVar1) {
    local_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_20 = 0x167;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[26]>
              (debug_assert::detail::always_false,&local_28,"","conversion would overflow");
    puVar5 = (ulong *)debug_assert::detail::regular_void::operator_cast_to_long_(&local_11);
    local_160 = *puVar5;
  }
  else {
    local_160 = *local_10;
  }
  local_d8 = local_160;
  local_40 = local_c8;
  local_48 = &local_d8;
  local_150 = local_160;
  local_f8 = get<type_safe::difference_t,type_safe::integer<long,type_safe::undefined_behavior_arithmetic>>
                       (&local_138->
                         super_strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
                       );
  local_f0 = &local_150;
  local_50 = local_150;
  local_58 = local_f8->value_;
  local_98 = local_f8;
  local_90 = local_f0;
  bVar2 = detail::will_addition_error<long>(local_150,local_58);
  if (bVar2) {
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
    ;
    local_68 = 0x91;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[33]>
              (debug_assert::detail::always_false,&local_70,"","addition will result in overflow");
    piVar4 = (integer_type_conflict1 *)
             debug_assert::detail::regular_void::operator_cast_to_long_(&local_59);
    local_178 = *piVar4;
  }
  else {
    local_178 = local_50 + local_58;
  }
  local_100 = local_178;
  local_30 = local_e8;
  local_38 = &local_100;
  local_148 = local_178;
  local_110 = &local_148;
  local_120 = local_178;
  local_a0 = &local_120;
  local_88 = local_110;
  if ((long)local_178 < 0) {
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_b0 = 0x186;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[27]>
              (debug_assert::detail::always_false,&local_b8,"","conversion would underflow");
    puVar5 = debug_assert::detail::regular_void::operator_cast_to_unsigned_long_(&local_a1);
    local_188.value_ = *puVar5;
  }
  else {
    local_188.value_ = local_178;
  }
  local_118 = local_188.value_;
  local_78 = local_108;
  local_80 = &local_118;
  local_140 = local_188.value_;
  index_t::index_t<unsigned_long,type_safe::undefined_behavior_arithmetic,void>
            ((index_t *)&lhs_local,local_188);
  return (strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
          )(strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
            )lhs_local;
}

Assistant:

constexpr index_t operator+(const index_t& lhs, const difference_t& rhs) noexcept
{
    return index_t(make_unsigned(make_signed(get(lhs)) + get(rhs)));
}